

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereClauseInsert(WhereClause *pWC,Expr *p,u16 wtFlags)

{
  sqlite3 *db;
  LogEst LVar1;
  short sVar2;
  int iVar3;
  WhereTerm *__dest;
  Expr *pEVar4;
  WhereTerm *pWVar5;
  
  iVar3 = pWC->nTerm;
  if (pWC->nSlot <= iVar3) {
    pWVar5 = pWC->a;
    db = pWC->pWInfo->pParse->db;
    __dest = (WhereTerm *)sqlite3DbMallocRawNN(db,(long)pWC->nSlot << 7);
    pWC->a = __dest;
    if (__dest == (WhereTerm *)0x0) {
      if ((wtFlags & 1) != 0) {
        sqlite3ExprDelete(db,p);
      }
      pWC->a = pWVar5;
      return 0;
    }
    memcpy(__dest,pWVar5,(long)pWC->nTerm << 6);
    if (pWVar5 != pWC->aStatic) {
      sqlite3DbFree(db,pWVar5);
    }
    iVar3 = sqlite3DbMallocSize(db,pWC->a);
    pWC->nSlot = iVar3 >> 6;
    iVar3 = pWC->nTerm;
  }
  pWC->nTerm = iVar3 + 1;
  pWVar5 = pWC->a + iVar3;
  sVar2 = 1;
  if ((p != (Expr *)0x0) && ((p->flags & 0x40000) != 0)) {
    LVar1 = sqlite3LogEst((long)p->iTable);
    sVar2 = LVar1 + -0x10e;
  }
  pWVar5->truthProb = sVar2;
  pEVar4 = sqlite3ExprSkipCollate(p);
  pWVar5->pExpr = pEVar4;
  pWVar5->wtFlags = wtFlags;
  pWVar5->pWC = pWC;
  pWVar5->eOperator = 0;
  pWVar5->nChild = '\0';
  pWVar5->eMatchOp = '\0';
  pWVar5->iParent = 0;
  pWVar5->leftCursor = 0;
  pWVar5->iField = 0;
  *(undefined8 *)&pWVar5->field_0x24 = 0;
  *(undefined8 *)((long)&pWVar5->u + 4) = 0;
  pWVar5->prereqRight = 0;
  pWVar5->prereqAll = 0;
  return iVar3;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u16 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pWInfo->pParse->db;
    pWC->a = sqlite3DbMallocRawNN(db, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    if( pOld!=pWC->aStatic ){
      sqlite3DbFree(db, pOld);
    }
    pWC->nSlot = sqlite3DbMallocSize(db, pWC->a)/sizeof(pWC->a[0]);
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  if( p && ExprHasProperty(p, EP_Unlikely) ){
    pTerm->truthProb = sqlite3LogEst(p->iTable) - 270;
  }else{
    pTerm->truthProb = 1;
  }
  pTerm->pExpr = sqlite3ExprSkipCollate(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  memset(&pTerm->eOperator, 0,
         sizeof(WhereTerm) - offsetof(WhereTerm,eOperator));
  return idx;
}